

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::GenericSchemaValidator
          (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
           *this,GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                 *schemaDocument,SchemaType *root,char *basePath,size_t basePathSize,uint depth,
          CrtAllocator *allocator,size_t schemaStackCapacity,size_t documentStackCapacity)

{
  char *__dest;
  
  (this->
  super_ISchemaStateFactory<rapidjson::internal::Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
  )._vptr_ISchemaStateFactory = (_func_int **)&PTR__GenericSchemaValidator_00160288;
  (this->super_ISchemaValidator)._vptr_ISchemaValidator =
       (_func_int **)&PTR__GenericSchemaValidator_00160438;
  (this->
  super_IValidationErrorHandler<rapidjson::internal::Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
  )._vptr_IValidationErrorHandler = (_func_int **)&PTR__GenericSchemaValidator_00160470;
  this->schemaDocument_ = schemaDocument;
  this->root_ = root;
  this->stateAllocator_ = allocator;
  this->ownStateAllocator_ = (CrtAllocator *)0x0;
  (this->schemaStack_).allocator_ = allocator;
  (this->schemaStack_).ownAllocator_ = (CrtAllocator *)0x0;
  (this->schemaStack_).stack_ = (char *)0x0;
  (this->schemaStack_).stackTop_ = (char *)0x0;
  (this->schemaStack_).stackEnd_ = (char *)0x0;
  (this->schemaStack_).initialCapacity_ = schemaStackCapacity;
  (this->documentStack_).allocator_ = allocator;
  (this->documentStack_).ownAllocator_ = (CrtAllocator *)0x0;
  (this->documentStack_).stack_ = (char *)0x0;
  (this->documentStack_).stackTop_ = (char *)0x0;
  (this->documentStack_).stackEnd_ = (char *)0x0;
  (this->documentStack_).initialCapacity_ = documentStackCapacity;
  (this->error_).data_.s.str = (Ch *)0x0;
  this->outputHandler_ = (BaseReaderHandler<rapidjson::UTF8<char>,_void> *)0x0;
  (this->error_).data_.n = (Number)0x0;
  (this->error_).data_.f.flags = 3;
  (this->missingDependents_).data_.n = (Number)0x0;
  (this->missingDependents_).data_.s.str = (Ch *)0x0;
  (this->currentError_).data_.n = (Number)0x0;
  (this->currentError_).data_.s.str = (Ch *)0x0;
  this->valid_ = true;
  this->flags_ = 0;
  this->depth_ = depth;
  if (basePathSize != 0 && basePath != (char *)0x0) {
    __dest = internal::Stack<rapidjson::CrtAllocator>::Push<char>
                       (&this->documentStack_,basePathSize);
    memcpy(__dest,basePath,basePathSize);
    return;
  }
  return;
}

Assistant:

GenericSchemaValidator( 
        const SchemaDocumentType& schemaDocument,
        const SchemaType& root,
        const char* basePath, size_t basePathSize,
        unsigned depth,
        StateAllocator* allocator = 0,
        size_t schemaStackCapacity = kDefaultSchemaStackCapacity,
        size_t documentStackCapacity = kDefaultDocumentStackCapacity)
        :
        schemaDocument_(&schemaDocument),
        root_(root),
        stateAllocator_(allocator),
        ownStateAllocator_(0),
        schemaStack_(allocator, schemaStackCapacity),
        documentStack_(allocator, documentStackCapacity),
        outputHandler_(0),
        error_(kObjectType),
        currentError_(),
        missingDependents_(),
        valid_(true),
        flags_(kValidateDefaultFlags),
        depth_(depth)
    {
        RAPIDJSON_SCHEMA_PRINT(Method, "GenericSchemaValidator::GenericSchemaValidator (internal)", basePath && basePathSize ? basePath : "");
        if (basePath && basePathSize)
            memcpy(documentStack_.template Push<char>(basePathSize), basePath, basePathSize);
    }